

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseCharRef(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  char *msg;
  xmlParserInputPtr pxVar3;
  xmlParserErrors code;
  uint int1;
  int iVar4;
  
  pxVar3 = ctxt->input;
  pxVar2 = pxVar3->cur;
  if (*pxVar2 == '&') {
    if ((pxVar2[1] == '#') && (pxVar2[2] == 'x')) {
      pxVar3->cur = pxVar2 + 3;
      pxVar3->col = pxVar3->col + 3;
      if (pxVar2[3] == '\0') {
        xmlParserGrow(ctxt);
      }
      pxVar3 = ctxt->input;
      if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      pxVar3 = ctxt->input;
      pxVar2 = pxVar3->cur;
      int1 = 0;
      if (*pxVar2 != ';') {
        iVar4 = 0;
        int1 = 0;
        do {
          if (1 < ctxt->disableSAX) break;
          if (iVar4 < 0x15) {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar4 = 0;
            if (((pxVar3->flags & 0x40) == 0) &&
               (iVar4 = 0, (long)pxVar3->end - (long)pxVar2 < 0xfa)) {
              xmlParserGrow(ctxt);
            }
          }
          bVar1 = *ctxt->input->cur;
          if (9 < (byte)(bVar1 - 0x30)) {
            if ((0x60 < bVar1) && (iVar4 < 0x14 && bVar1 < 0x67)) {
              int1 = (int1 * 0x10 + (uint)bVar1) - 0x57;
              goto LAB_00130094;
            }
            if (((0x40 < bVar1) && (bVar1 < 0x47)) && (iVar4 < 0x14)) {
              int1 = (int1 * 0x10 + (uint)bVar1) - 0x37;
              goto LAB_00130094;
            }
            code = XML_ERR_INVALID_HEX_CHARREF;
LAB_00130295:
            int1 = 0;
            xmlFatalErr(ctxt,code,(char *)0x0);
            break;
          }
          int1 = (int1 * 0x10 + (uint)bVar1) - 0x30;
LAB_00130094:
          if (0x10ffff < (int)int1) {
            int1 = 0x110000;
          }
          xmlNextChar(ctxt);
          iVar4 = iVar4 + 1;
          pxVar3 = ctxt->input;
          pxVar2 = pxVar3->cur;
        } while (*pxVar2 != ';');
      }
    }
    else {
      if (pxVar2[1] != '#') {
        pxVar3->cur = pxVar2 + 1;
        pxVar3->col = pxVar3->col + 1;
        if (pxVar2[1] == '\0') {
          xmlParserGrow(ctxt);
        }
        goto LAB_001301bb;
      }
      pxVar3->cur = pxVar2 + 2;
      pxVar3->col = pxVar3->col + 2;
      if (pxVar2[2] == '\0') {
        xmlParserGrow(ctxt);
      }
      pxVar3 = ctxt->input;
      if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      pxVar3 = ctxt->input;
      pxVar2 = pxVar3->cur;
      int1 = 0;
      if (*pxVar2 != ';') {
        iVar4 = 0;
        int1 = 0;
        do {
          if (iVar4 < 0x15) {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar4 = 0;
            if (((pxVar3->flags & 0x40) == 0) &&
               (iVar4 = 0, (long)pxVar3->end - (long)pxVar2 < 0xfa)) {
              xmlParserGrow(ctxt);
            }
          }
          bVar1 = *ctxt->input->cur;
          if (9 < (byte)(bVar1 - 0x30)) {
            code = XML_ERR_INVALID_DEC_CHARREF;
            goto LAB_00130295;
          }
          int1 = ((uint)bVar1 + int1 * 10) - 0x30;
          if (0x10ffff < (int)int1) {
            int1 = 0x110000;
          }
          xmlNextChar(ctxt);
          iVar4 = iVar4 + 1;
          pxVar3 = ctxt->input;
          pxVar2 = pxVar3->cur;
        } while (*pxVar2 != ';');
      }
    }
    pxVar3 = ctxt->input;
    if (*pxVar3->cur == ';') {
      pxVar3->col = pxVar3->col + 1;
      pxVar3->cur = pxVar3->cur + 1;
    }
  }
  else {
LAB_001301bb:
    int1 = 0;
    xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
  }
  if ((int)int1 < 0x110000) {
    if ((int)int1 < 0x100) {
      if (0x1f < (int)int1) {
        return int1;
      }
      msg = "xmlParseCharRef: invalid xmlChar value %d\n";
      if ((int1 < 0xe) && ((0x2600U >> (int1 & 0x1f) & 1) != 0)) {
        return int1;
      }
    }
    else {
      if (int1 - 0x10000 < 0xffffd800 || int1 - 0xe000 < 0x1ffe) {
        return int1;
      }
      msg = "xmlParseCharRef: invalid xmlChar value %d\n";
    }
  }
  else {
    msg = "xmlParseCharRef: character reference out of bounds\n";
  }
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,(xmlChar *)0x0,
             (xmlChar *)0x0,(xmlChar *)0x0,int1,msg,int1);
  return 0;
}

Assistant:

int
xmlParseCharRef(xmlParserCtxtPtr ctxt) {
    int val = 0;
    int count = 0;

    /*
     * Using RAW/CUR/NEXT is okay since we are working on ASCII range here
     */
    if ((RAW == '&') && (NXT(1) == '#') &&
        (NXT(2) == 'x')) {
	SKIP(3);
	GROW;
	while ((RAW != ';') && (PARSER_STOPPED(ctxt) == 0)) {
	    if (count++ > 20) {
		count = 0;
		GROW;
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 16 + (CUR - '0');
	    else if ((RAW >= 'a') && (RAW <= 'f') && (count < 20))
	        val = val * 16 + (CUR - 'a') + 10;
	    else if ((RAW >= 'A') && (RAW <= 'F') && (count < 20))
	        val = val * 16 + (CUR - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else if  ((RAW == '&') && (NXT(1) == '#')) {
	SKIP(2);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 10 + (CUR - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else {
        if (RAW == '&')
            SKIP(1);
        xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
    }

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseCharRef: character reference out of bounds\n",
	        val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseCharRef: invalid xmlChar value %d\n",
	                  val);
    }
    return(0);
}